

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Exp_PrintNodeVerilog(FILE *pFile,int nVars,Vec_Int_t *p,Vec_Ptr_t *vNames,int Node,int fCompl)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = Node * 2 + 1;
  iVar3 = Vec_IntEntry(p,iVar5);
  iVar2 = nVars * 2;
  if (SBORROW4(iVar3,iVar2) == iVar3 + nVars * -2 < 0) {
    fputc(0x28,(FILE *)pFile);
  }
  iVar3 = Node * 2;
  uVar4 = Vec_IntEntry(p,iVar5);
  Exp_PrintLitVerilog(pFile,nVars,p,vNames,uVar4 ^ fCompl);
  iVar5 = Vec_IntEntry(p,iVar5);
  if (SBORROW4(iVar5,iVar2) == iVar5 + nVars * -2 < 0) {
    fputc(0x29,(FILE *)pFile);
  }
  uVar1 = 0x7c;
  if (fCompl == 0) {
    uVar1 = 0x26;
  }
  fprintf((FILE *)pFile," %c ",uVar1);
  iVar5 = Vec_IntEntry(p,iVar3);
  if (SBORROW4(iVar5,iVar2) == iVar5 + nVars * -2 < 0) {
    fputc(0x28,(FILE *)pFile);
  }
  uVar4 = Vec_IntEntry(p,iVar3);
  Exp_PrintLitVerilog(pFile,nVars,p,vNames,fCompl ^ uVar4);
  iVar5 = Vec_IntEntry(p,iVar3);
  if (SBORROW4(iVar5,iVar2) != iVar5 + nVars * -2 < 0) {
    return;
  }
  fputc(0x29,(FILE *)pFile);
  return;
}

Assistant:

void Exp_PrintNodeVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Node, int fCompl )
{
    extern void Exp_PrintLitVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Lit );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+1) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, ")" );
    fprintf( pFile, " %c ", fCompl ? '|' : '&' );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+0) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, ")" );
}